

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O1

void __thiscall iutest::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer __src;
  pointer *pppTVar1;
  pointer ppTVar2;
  TestSuite *pTVar3;
  pointer ppTVar4;
  
  ppTVar4 = (this->m_testsuites).
            super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppTVar2 = (this->m_testsuites).
                   super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish, ppTVar4 != ppTVar2) {
    pTVar3 = *ppTVar4;
    __src = ppTVar4 + 1;
    if (__src != ppTVar2) {
      memmove(ppTVar4,__src,(long)ppTVar2 - (long)__src);
    }
    pppTVar1 = &(this->m_testsuites).
                super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + -1;
    if (pTVar3 != (TestSuite *)0x0) {
      (*pTVar3->_vptr_TestSuite[1])(pTVar3);
    }
    ppTVar4 = (this->m_testsuites).
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::~vector
            (&(this->m_ad_hoc_testresult).m_test_propertys);
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&(this->m_ad_hoc_testresult).m_test_part_results);
  ppTVar4 = (this->m_testsuites).
            super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4,(long)(this->m_testsuites).
                                  super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar4
                   );
    return;
  }
  return;
}

Assistant:

~UnitTestImpl() { TerminateImpl(); }